

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

uint64_t nn_get_statistic(int s,int statistic)

{
  int iVar1;
  int *piVar2;
  int in_ESI;
  uint64_t val;
  nn_sock *sock;
  int rc;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_8;
  
  iVar1 = nn_global_hold_socket
                    ((nn_sock **)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
  if (iVar1 < 0) {
    iVar1 = -iVar1;
    piVar2 = __errno_location();
    *piVar2 = iVar1;
    local_8 = 0xffffffffffffffff;
  }
  else {
    if (in_ESI == 0x65) {
      local_28 = *(uint64_t *)(local_20 + 400);
    }
    else if (in_ESI == 0x66) {
      local_28 = *(uint64_t *)(local_20 + 0x198);
    }
    else if (in_ESI == 0x67) {
      local_28 = *(uint64_t *)(local_20 + 0x1a0);
    }
    else if (in_ESI == 0x68) {
      local_28 = *(uint64_t *)(local_20 + 0x1a8);
    }
    else if (in_ESI == 0x69) {
      local_28 = *(uint64_t *)(local_20 + 0x1b0);
    }
    else if (in_ESI == 0x6a) {
      local_28 = *(uint64_t *)(local_20 + 0x1b8);
    }
    else if (in_ESI == 0x6b) {
      local_28 = *(uint64_t *)(local_20 + 0x1b8);
    }
    else if (in_ESI == 0xc9) {
      local_28 = (uint64_t)*(int *)(local_20 + 0x1e8);
    }
    else if (in_ESI == 0xca) {
      local_28 = (uint64_t)*(int *)(local_20 + 0x1ec);
    }
    else if (in_ESI == 0xcb) {
      local_28 = (uint64_t)*(int *)(local_20 + 500);
    }
    else if (in_ESI == 0x12d) {
      local_28 = *(uint64_t *)(local_20 + 0x1c8);
    }
    else if (in_ESI == 0x12e) {
      local_28 = *(uint64_t *)(local_20 + 0x1d0);
    }
    else if (in_ESI == 0x12f) {
      local_28 = *(uint64_t *)(local_20 + 0x1d8);
    }
    else if (in_ESI == 0x130) {
      local_28 = *(uint64_t *)(local_20 + 0x1e0);
    }
    else if (in_ESI == 0x191) {
      local_28 = (uint64_t)*(int *)(local_20 + 0x1f0);
    }
    else {
      local_28 = 0xffffffffffffffff;
      piVar2 = __errno_location();
      *piVar2 = 0x16;
    }
    nn_global_rele_socket((nn_sock *)0x134d24);
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

uint64_t nn_get_statistic (int s, int statistic)
{
    int rc;
    struct nn_sock *sock;
    uint64_t val;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return (uint64_t)-1;
    }

    switch (statistic) {
    case NN_STAT_ESTABLISHED_CONNECTIONS:
        val = sock->statistics.established_connections;
        break;
    case NN_STAT_ACCEPTED_CONNECTIONS:
        val = sock->statistics.accepted_connections;
        break;
    case NN_STAT_DROPPED_CONNECTIONS:
        val = sock->statistics.dropped_connections;
        break;
    case NN_STAT_BROKEN_CONNECTIONS:
        val = sock->statistics.broken_connections;
        break;
    case NN_STAT_CONNECT_ERRORS:
        val = sock->statistics.connect_errors;
        break;
    case NN_STAT_BIND_ERRORS:
        val = sock->statistics.bind_errors;
        break;
    case NN_STAT_ACCEPT_ERRORS:
        val = sock->statistics.bind_errors;
        break;
    case NN_STAT_MESSAGES_SENT:
        val = sock->statistics.messages_sent;
        break;
    case NN_STAT_MESSAGES_RECEIVED:
        val = sock->statistics.messages_received;
        break;
    case NN_STAT_BYTES_SENT:
        val = sock->statistics.bytes_sent;
        break;
    case NN_STAT_BYTES_RECEIVED:
        val = sock->statistics.bytes_received;
        break;
    case NN_STAT_CURRENT_CONNECTIONS:
        val = sock->statistics.current_connections;
        break;
    case NN_STAT_INPROGRESS_CONNECTIONS:
        val = sock->statistics.inprogress_connections;
        break;
    case NN_STAT_CURRENT_SND_PRIORITY:
        val = sock->statistics.current_snd_priority;
        break;
    case NN_STAT_CURRENT_EP_ERRORS:
        val = sock->statistics.current_ep_errors;
        break;
    default:
        val = (uint64_t)-1;
        errno = EINVAL;
        break;
    }

    nn_global_rele_socket (sock);
    return val;
}